

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

string * __thiscall
glcts::InterfaceMatchingCase::getTestTypeName_abi_cxx11_
          (string *__return_storage_ptr__,InterfaceMatchingCase *this,TestType testType)

{
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  TestType local_1c;
  InterfaceMatchingCase *pIStack_18;
  TestType testType_local;
  InterfaceMatchingCase *this_local;
  
  local_1c = testType;
  pIStack_18 = this;
  this_local = (InterfaceMatchingCase *)__return_storage_ptr__;
  if (testType == DEFAULT_PRECISION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"use predeclared precision",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else if (testType == SET_DEFAULT_PRECISION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"set default precision",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (testType == SET_PRECISION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"explicit precision",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTestTypeName(TestType testType)
	{
		switch (testType)
		{
		case DEFAULT_PRECISION:
			return "use predeclared precision";
		case SET_DEFAULT_PRECISION:
			return "set default precision";
		case SET_PRECISION:
			return "explicit precision";
		}
		return "";
	}